

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O0

int dospit(void)

{
  int iVar1;
  schar local_1b;
  schar local_1a;
  schar local_19;
  schar dz;
  schar dy;
  obj *poStack_18;
  schar dx;
  obj *otmp;
  
  iVar1 = getdir((char *)0x0,&local_19,&local_1a,&local_1b);
  if (iVar1 == 0) {
    otmp._4_4_ = 0;
  }
  else {
    iVar1 = 0x219;
    if (u.umonnum == 0xe1) {
      iVar1 = 0x218;
    }
    poStack_18 = mksobj(level,iVar1,'\x01','\0');
    poStack_18->spe = '\x01';
    throwit(poStack_18,(obj *)0x0,0,'\0',local_19,local_1a,local_1b);
    otmp._4_4_ = 1;
  }
  return otmp._4_4_;
}

Assistant:

int dospit(void)
{
	struct obj *otmp;
	schar dx, dy, dz;

	if (!getdir(NULL, &dx, &dy, &dz))
	    return 0;
	otmp = mksobj(level, u.umonnum==PM_COBRA ? BLINDING_VENOM : ACID_VENOM,
			TRUE, FALSE);
	otmp->spe = 1; /* to indicate it's yours */
	throwit(otmp, NULL, 0L, FALSE, dx, dy, dz);
	return 1;
}